

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Game::getGuessedNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Game *this)

{
  bool bVar1;
  Game *this_00;
  int i;
  long lVar2;
  int local_4c;
  string input;
  
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  this_00 = (Game *)__return_storage_ptr__;
  while( true ) {
    bVar1 = isInputValid(this_00,&input);
    if (bVar1) break;
    std::operator<<((ostream *)&std::cout,"Enter 4 numbers from 0 to 9:\n");
    this_00 = (Game *)&std::cin;
    std::operator>>((istream *)&std::cin,(string *)&input);
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,4);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    local_4c = input._M_dataplus._M_p[lVar2] + -0x30;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_4c);
  }
  std::__cxx11::string::~string((string *)&input);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> Game::getGuessedNumbers()
{
	std::string input{};
	while (not isInputValid(input))
	{
		std::cout << "Enter 4 numbers from 0 to 9:\n";
		std::cin >> input;
	}
	std::vector<int32_t> guessedNumbers;
	guessedNumbers.reserve(length);
	for (auto i = 0; i < length; ++i)
		guessedNumbers.push_back(input[i] - '0');
	return guessedNumbers;
}